

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

void __thiscall TTD::SlabAllocatorBase<8>::AddNewBlock(SlabAllocatorBase<8> *this)

{
  SlabBlock *pSVar1;
  HeapAllocator *this_00;
  uchar *alloc;
  SlabBlock *pSVar2;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  data.plusSize = (size_t)this->m_slabBlockSize;
  local_38 = (undefined1  [8])&unsigned_char::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_3eb50dd;
  data.filename._0_4_ = 0x1bb;
  this_00 = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_38);
  alloc = (uchar *)Memory::HeapAllocator::AllocT<true>(this_00,(ulong)this->m_slabBlockSize);
  pSVar2 = (SlabBlock *)TTD_MEM_ALLOC_CHECK<unsigned_char>(alloc);
  if (((ulong)pSVar2 & 3) == 0) {
    this->m_currPos = (byte *)(pSVar2 + 1);
    this->m_endPos = (uchar *)((long)&pSVar2->BlockData + (ulong)this->m_slabBlockSize);
    pSVar2->BlockData = (byte *)(pSVar2 + 1);
    pSVar2->Next = (SlabBlock *)0x0;
    pSVar1 = this->m_headBlock;
    pSVar2->Previous = pSVar1;
    pSVar2->RefCounter = 0;
    pSVar1->Next = pSVar2;
    this->m_headBlock = pSVar2;
    return;
  }
  TTDAbort_unrecoverable_error
            ("We have non-word aligned allocations so all our later work is not so useful");
}

Assistant:

void AddNewBlock()
        {
            byte* allocBlock = TT_HEAP_ALLOC_ARRAY(byte, this->m_slabBlockSize);
            TTDAssert((reinterpret_cast<uint64>(allocBlock) & 0x3) == 0, "We have non-word aligned allocations so all our later work is not so useful");

            SlabBlock* newBlock = (SlabBlock*)allocBlock;
            byte* dataArray = (allocBlock + TTD_SLAB_BLOCK_SIZE);

            this->m_currPos = dataArray;
            this->m_endPos = dataArray + TTD_SLAB_BLOCK_USABLE_SIZE(this->m_slabBlockSize);

            newBlock->BlockData = dataArray;
            newBlock->Next = nullptr;
            newBlock->Previous = this->m_headBlock;
            newBlock->RefCounter = 0;

            this->m_headBlock->Next = newBlock;
            this->m_headBlock = newBlock;
        }